

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::RewriteDebugDeclares
          (LocalSingleStoreElimPass *this,Instruction *store_inst,uint32_t var_id)

{
  IRContext *pIVar1;
  bool bVar2;
  bool bVar3;
  uint32_t value_id;
  uint uVar4;
  
  uVar4 = (store_inst->has_result_id_ & 1) + 1;
  if (store_inst->has_type_id_ == false) {
    uVar4 = (uint)store_inst->has_result_id_;
  }
  value_id = Instruction::GetSingleWordOperand(store_inst,uVar4 + 1);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
    IRContext::BuildDebugInfoManager(pIVar1);
  }
  bVar2 = analysis::DebugInfoManager::AddDebugValueForVariable
                    ((pIVar1->debug_info_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                     _M_head_impl,store_inst,var_id,value_id,store_inst);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
    IRContext::BuildDebugInfoManager(pIVar1);
  }
  bVar3 = analysis::DebugInfoManager::KillDebugDeclares
                    ((pIVar1->debug_info_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                     _M_head_impl,var_id);
  return bVar3 || bVar2;
}

Assistant:

bool LocalSingleStoreElimPass::RewriteDebugDeclares(Instruction* store_inst,
                                                    uint32_t var_id) {
  uint32_t value_id = store_inst->GetSingleWordInOperand(1);
  bool modified = context()->get_debug_info_mgr()->AddDebugValueForVariable(
      store_inst, var_id, value_id, store_inst);
  modified |= context()->get_debug_info_mgr()->KillDebugDeclares(var_id);
  return modified;
}